

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
mxx::impl::surplus_send_pairing
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          vector<long,_std::allocator<long>_> *surpluses,int p,int rank,bool send_deficit)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  long *plVar6;
  reference pvVar7;
  pair<int,_long> pVar8;
  byte local_1e9;
  byte local_169;
  value_type local_120;
  int local_10c;
  long lStack_108;
  int j_1;
  long local_100;
  longlong min_1;
  long local_f0;
  value_type local_e8;
  int local_d4;
  long lStack_d0;
  int j;
  long local_c8;
  longlong min;
  long local_b8;
  value_type local_b0;
  int local_9c;
  undefined1 local_98 [4];
  int i;
  queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
  fifo;
  allocator<unsigned_long> local_31;
  value_type_conflict1 local_30;
  byte local_22;
  byte local_21;
  int local_20;
  int iStack_1c;
  bool send_deficit_local;
  int rank_local;
  int p_local;
  vector<long,_std::allocator<long>_> *surpluses_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *send_counts;
  
  local_22 = 0;
  local_30 = 0;
  local_21 = send_deficit;
  local_20 = rank;
  iStack_1c = p;
  _rank_local = surpluses;
  surpluses_local = (vector<long,_std::allocator<long>_> *)__return_storage_ptr__;
  std::allocator<unsigned_long>::allocator(&local_31);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,(long)p,&local_30,&local_31);
  std::allocator<unsigned_long>::~allocator(&local_31);
  std::
  queue<std::pair<int,long>,std::deque<std::pair<int,long>,std::allocator<std::pair<int,long>>>>::
  queue<std::deque<std::pair<int,long>,std::allocator<std::pair<int,long>>>,void>
            ((queue<std::pair<int,long>,std::deque<std::pair<int,long>,std::allocator<std::pair<int,long>>>>
              *)local_98);
  for (local_9c = 0; local_9c < iStack_1c; local_9c = local_9c + 1) {
    pvVar4 = std::vector<long,_std::allocator<long>_>::operator[](_rank_local,(long)local_9c);
    if (*pvVar4 != 0) {
      bVar3 = std::
              queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
              ::empty((queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                       *)local_98);
      if (bVar3) {
        pvVar4 = std::vector<long,_std::allocator<long>_>::operator[](_rank_local,(long)local_9c);
        pVar8 = std::make_pair<int&,long&>(&local_9c,pvVar4);
        local_b0.second = pVar8.second;
        local_b0.first = pVar8.first;
        std::
        queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
        ::push((queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                *)local_98,&local_b0);
      }
      else {
        pvVar4 = std::vector<long,_std::allocator<long>_>::operator[](_rank_local,(long)local_9c);
        if (*pvVar4 < 1) {
          pvVar4 = std::vector<long,_std::allocator<long>_>::operator[](_rank_local,(long)local_9c);
          if (*pvVar4 < 0) {
            pvVar5 = std::
                     queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                     ::front((queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                              *)local_98);
            if (pvVar5->second < 0) {
              pvVar4 = std::vector<long,_std::allocator<long>_>::operator[]
                                 (_rank_local,(long)local_9c);
              pVar8 = std::make_pair<int&,long&>(&local_9c,pvVar4);
              local_f0 = pVar8.second;
              min_1._0_4_ = pVar8.first;
              std::
              queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
              ::push((queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                      *)local_98,(value_type *)&min_1);
            }
            else {
              while( true ) {
                pvVar4 = std::vector<long,_std::allocator<long>_>::operator[]
                                   (_rank_local,(long)local_9c);
                local_1e9 = 0;
                if (*pvVar4 < 0) {
                  bVar3 = std::
                          queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                          ::empty((queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                                   *)local_98);
                  local_1e9 = bVar3 ^ 0xff;
                }
                if ((local_1e9 & 1) == 0) break;
                pvVar4 = std::vector<long,_std::allocator<long>_>::operator[]
                                   (_rank_local,(long)local_9c);
                lStack_108 = -*pvVar4;
                pvVar5 = std::
                         queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                         ::front((queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                                  *)local_98);
                plVar6 = std::min<long>(&stack0xfffffffffffffef8,&pvVar5->second);
                local_100 = *plVar6;
                pvVar5 = std::
                         queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                         ::front((queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                                  *)local_98);
                lVar1 = local_100;
                local_10c = pvVar5->first;
                pvVar4 = std::vector<long,_std::allocator<long>_>::operator[]
                                   (_rank_local,(long)local_9c);
                lVar2 = local_100;
                *pvVar4 = *pvVar4 + lVar1;
                pvVar5 = std::
                         queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                         ::front((queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                                  *)local_98);
                pvVar5->second = pvVar5->second - lVar2;
                pvVar5 = std::
                         queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                         ::front((queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                                  *)local_98);
                if (pvVar5->second == 0) {
                  std::
                  queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                  ::pop((queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                         *)local_98);
                }
                lVar1 = local_100;
                if ((local_20 == local_9c) && ((local_21 & 1) != 0)) {
                  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                     (__return_storage_ptr__,(long)local_10c);
                  *pvVar7 = lVar1 + *pvVar7;
                }
                else if (local_20 == local_10c) {
                  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                     (__return_storage_ptr__,(long)local_9c);
                  *pvVar7 = lVar1 + *pvVar7;
                }
              }
              pvVar4 = std::vector<long,_std::allocator<long>_>::operator[]
                                 (_rank_local,(long)local_9c);
              if (*pvVar4 < 0) {
                pvVar4 = std::vector<long,_std::allocator<long>_>::operator[]
                                   (_rank_local,(long)local_9c);
                pVar8 = std::make_pair<int&,long&>(&local_9c,pvVar4);
                local_120.second = pVar8.second;
                local_120.first = pVar8.first;
                std::
                queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                ::push((queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                        *)local_98,&local_120);
              }
            }
          }
        }
        else {
          pvVar5 = std::
                   queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                   ::front((queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                            *)local_98);
          if (pvVar5->second < 1) {
            while( true ) {
              pvVar4 = std::vector<long,_std::allocator<long>_>::operator[]
                                 (_rank_local,(long)local_9c);
              local_169 = 0;
              if (0 < *pvVar4) {
                bVar3 = std::
                        queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                        ::empty((queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                                 *)local_98);
                local_169 = bVar3 ^ 0xff;
              }
              if ((local_169 & 1) == 0) break;
              pvVar4 = std::vector<long,_std::allocator<long>_>::operator[]
                                 (_rank_local,(long)local_9c);
              pvVar5 = std::
                       queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                       ::front((queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                                *)local_98);
              lStack_d0 = -pvVar5->second;
              plVar6 = std::min<long>(pvVar4,&stack0xffffffffffffff30);
              local_c8 = *plVar6;
              pvVar5 = std::
                       queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                       ::front((queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                                *)local_98);
              lVar1 = local_c8;
              local_d4 = pvVar5->first;
              pvVar4 = std::vector<long,_std::allocator<long>_>::operator[]
                                 (_rank_local,(long)local_9c);
              lVar2 = local_c8;
              *pvVar4 = *pvVar4 - lVar1;
              pvVar5 = std::
                       queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                       ::front((queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                                *)local_98);
              pvVar5->second = pvVar5->second + lVar2;
              pvVar5 = std::
                       queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                       ::front((queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                                *)local_98);
              if (pvVar5->second == 0) {
                std::
                queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                ::pop((queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                       *)local_98);
              }
              lVar1 = local_c8;
              if (local_20 == local_9c) {
                pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (__return_storage_ptr__,(long)local_d4);
                *pvVar7 = lVar1 + *pvVar7;
              }
              else if ((local_20 == local_d4) && ((local_21 & 1) != 0)) {
                pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (__return_storage_ptr__,(long)local_9c);
                *pvVar7 = lVar1 + *pvVar7;
              }
            }
            pvVar4 = std::vector<long,_std::allocator<long>_>::operator[]
                               (_rank_local,(long)local_9c);
            if (0 < *pvVar4) {
              pvVar4 = std::vector<long,_std::allocator<long>_>::operator[]
                                 (_rank_local,(long)local_9c);
              pVar8 = std::make_pair<int&,long&>(&local_9c,pvVar4);
              local_e8.second = pVar8.second;
              local_e8.first = pVar8.first;
              std::
              queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
              ::push((queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                      *)local_98,&local_e8);
            }
          }
          else {
            pvVar4 = std::vector<long,_std::allocator<long>_>::operator[]
                               (_rank_local,(long)local_9c);
            pVar8 = std::make_pair<int&,long&>(&local_9c,pvVar4);
            local_b8 = pVar8.second;
            min._0_4_ = pVar8.first;
            std::
            queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
            ::push((queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                    *)local_98,(value_type *)&min);
          }
        }
      }
    }
  }
  bVar3 = std::
          queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
          ::empty((queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
                   *)local_98);
  if (!bVar3) {
    assert_fail("fifo.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
                ,0xbd,"surplus_send_pairing");
  }
  local_22 = 1;
  std::
  queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
  ::~queue((queue<std::pair<int,_long>,_std::deque<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>_>
            *)local_98);
  if ((local_22 & 1) == 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<size_t> surplus_send_pairing(std::vector<signed_size_t>& surpluses, int p, int rank, bool send_deficit = true) {
    // calculate the send and receive counts by a linear scan over
    // the surpluses, using a queue to keep track of all surpluses
    std::vector<size_t> send_counts(p, 0);
    std::queue<std::pair<int, signed_size_t> > fifo;
    for (int i = 0; i < p; ++i) {
        if (surpluses[i] == 0)
            continue;
        if (fifo.empty()) {
            fifo.push(std::make_pair(i, surpluses[i]));
        } else if (surpluses[i] > 0) {
            if (fifo.front().second > 0) {
                fifo.push(std::make_pair(i, surpluses[i]));
            } else {
                while (surpluses[i] > 0 && !fifo.empty())
                {
                    long long min = std::min(surpluses[i], -fifo.front().second);
                    int j = fifo.front().first;
                    surpluses[i] -= min;
                    fifo.front().second += min;
                    if (fifo.front().second == 0)
                        fifo.pop();
                    // these processors communicate!
                    if (rank == i)
                        send_counts[j] += min;
                    else if (rank == j && send_deficit)
                        send_counts[i] += min;
                }
                if (surpluses[i] > 0)
                    fifo.push(std::make_pair(i, surpluses[i]));
            }
        } else if (surpluses[i] < 0) {
            if (fifo.front().second < 0) {
                fifo.push(std::make_pair(i, surpluses[i]));
            } else {
                while (surpluses[i] < 0 && !fifo.empty())
                {
                    long long min = std::min(-surpluses[i], fifo.front().second);
                    int j = fifo.front().first;
                    surpluses[i] += min;
                    fifo.front().second -= min;
                    if (fifo.front().second == 0)
                        fifo.pop();
                    // these processors communicate!
                    if (rank == i && send_deficit)
                        send_counts[j] += min;
                    else if (rank == j)
                        send_counts[i] += min;
                }
                if (surpluses[i] < 0)
                    fifo.push(std::make_pair(i, surpluses[i]));
            }
        }
    }
    MXX_ASSERT(fifo.empty());

    return send_counts;
}